

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::StructColumnReader::RegisterPrefetch
          (StructColumnReader *this,ThriftFileTransport *transport,bool allow_merge)

{
  bool bVar1;
  iterator __lhs;
  pointer pCVar2;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *child;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  *__range1;
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
  local_28;
  long local_20;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_20 = in_RDI + 0x1f0;
  local_10 = in_RSI;
  local_28._M_current =
       (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
       std::
       vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  __lhs = std::
          vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
          ::end(in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    in_stack_ffffffffffffffc8 =
         (vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
          *)__gnu_cxx::
            __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
            ::operator*(&local_28);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                        *)0x859c10);
    if (bVar1) {
      pCVar2 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(__lhs._M_current);
      (*pCVar2->_vptr_ColumnReader[10])(pCVar2,local_10,(ulong)(local_11 & 1));
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void StructColumnReader::RegisterPrefetch(ThriftFileTransport &transport, bool allow_merge) {
	for (auto &child : child_readers) {
		if (!child) {
			continue;
		}
		child->RegisterPrefetch(transport, allow_merge);
	}
}